

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

void Abc_NtkDropOneOutput(Abc_Ntk_t *pNtk,int iOutput,int fSkipSweep,int fUseConst1)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  
  pAVar1 = Abc_NtkPo(pNtk,iOutput);
  pAVar3 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
  pAVar2 = Abc_AigConst1(pNtk);
  if (pAVar3 == pAVar2) {
    if ((*(uint *)&pAVar1->field_0x14 >> 10 & 1 ^ fUseConst1) != 1) {
      *(uint *)&pAVar1->field_0x14 = *(uint *)&pAVar1->field_0x14 ^ 0x400;
    }
  }
  else {
    pAVar3 = Abc_AigConst1(pNtk);
    pAVar3 = (Abc_Obj_t *)((ulong)(fUseConst1 == 0) ^ (ulong)pAVar3);
    Abc_ObjPatchFanin(pAVar1,(Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray],
                      (Abc_Obj_t *)((ulong)(*(uint *)&pAVar1->field_0x14 >> 10 & 1) ^ (ulong)pAVar3)
                     );
    pAVar1 = Abc_ObjChild0(pAVar1);
    if (pAVar1 != pAVar3) {
      __assert_fail("Abc_ObjChild0(pObj) == pConst0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                    ,0x730,"void Abc_NtkDropOneOutput(Abc_Ntk_t *, int, int, int)");
    }
    if (fSkipSweep == 0) {
      Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
      return;
    }
  }
  return;
}

Assistant:

void Abc_NtkDropOneOutput( Abc_Ntk_t * pNtk, int iOutput, int fSkipSweep, int fUseConst1 )
{
    Abc_Obj_t * pObj, * pConst0, * pFaninNew;
    pObj = Abc_NtkPo( pNtk, iOutput );
    if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pNtk) )
    {
        if ( !Abc_ObjFaninC0(pObj) ^ fUseConst1 )
            Abc_ObjXorFaninC( pObj, 0 );
        return;
    }
    pConst0 = Abc_ObjNotCond( Abc_AigConst1(pNtk), !fUseConst1 );
    pFaninNew = Abc_ObjNotCond( pConst0, Abc_ObjFaninC0(pObj) );
    Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pFaninNew );
    assert( Abc_ObjChild0(pObj) == pConst0 );
    if ( fSkipSweep )
        return;
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
}